

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  MallocMessageBuilder *this_00;
  uint *puVar1;
  bool bVar2;
  Iface *pIVar3;
  ForkHub<kj::_::Void> *pFVar4;
  Disposer *pDVar5;
  PromiseFulfiller<void> *pPVar6;
  Iface *pIVar7;
  TaskSet *this_01;
  PromiseArena *pPVar8;
  ArrayPtr<const_capnp::word> array;
  OwnPromiseNode node;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  word *pwVar12;
  size_t sVar13;
  int iVar14;
  undefined4 extraout_var;
  undefined8 *puVar16;
  WeakFulfiller<void> *params;
  void *pvVar17;
  ConnectionImpl *extraout_RAX;
  ConnectionImpl *extraout_RAX_00;
  ConnectionImpl *extraout_RAX_01;
  int *piVar18;
  char *pcVar19;
  SegmentBuilder *this_02;
  SegmentBuilder *pSVar20;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar21;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  DebugExpression<bool> _kjCondition;
  OwnPromiseNode local_d0;
  undefined1 local_c8 [48];
  Array<capnp::word> local_98;
  Builder local_78 [3];
  ConnectionImpl *pCVar15;
  
  pCVar15 = this->connection;
  bVar2 = pCVar15->idle;
  piVar18 = (int *)CONCAT71((int7)(__n >> 8),bVar2);
  local_c8._0_8_ = CONCAT71(local_c8._1_7_,bVar2) ^ 1;
  if ((bVar2 != false) && (piVar18 = &kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
    pcVar19 = "\"failed: expected \" \"!connection.idle\", _kjCondition";
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x173,ERROR,"\"failed: expected \" \"!connection.idle\", _kjCondition",
               (char (*) [34])"failed: expected !connection.idle",(DebugExpression<bool> *)local_c8)
    ;
    pCVar15 = this->connection;
    piVar18 = (int *)pcVar19;
  }
  this_00 = &this->message;
  pIVar3 = (pCVar15->vat->sendCallback).impl.ptr;
  iVar14 = (**pIVar3->_vptr_Iface)(pIVar3,this_00);
  pCVar15 = (ConnectionImpl *)CONCAT44(extraout_var,iVar14);
  if (((char)iVar14 != '\0') &&
     (pCVar15 = this->connection, (pCVar15->networkException).ptr.isSet == false)) {
    puVar1 = &pCVar15->vat->sent;
    *puVar1 = *puVar1 + 1;
    AVar21 = MessageBuilder::getSegmentsForOutput(&this_00->super_MessageBuilder);
    segments.ptr = (ArrayPtr<const_capnp::word> *)AVar21.size_;
    segments.size_ = (size_t)piVar18;
    messageToFlatArray(&local_98,(capnp *)AVar21.ptr,segments);
    puVar16 = (undefined8 *)operator_new(0x130);
    sVar13 = local_98.size_;
    pwVar12 = local_98.ptr;
    array.size_ = local_98.size_;
    array.ptr = local_98.ptr;
    local_c8._16_8_ = local_98.disposer;
    local_98.ptr = (word *)0x0;
    local_98.size_ = 0;
    *(undefined4 *)(puVar16 + 2) = 0;
    *puVar16 = &PTR_getBody_006ba070;
    puVar16[1] = &PTR_disposeImpl_006ba0a8;
    puVar16[3] = pwVar12;
    puVar16[4] = sVar13;
    puVar16[5] = local_98.disposer;
    local_c8._0_8_ = (SegmentBuilder *)0x0;
    local_c8._8_8_ = (WeakFulfillerBase *)0x0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    FlatArrayMessageReader::FlatArrayMessageReader
              ((FlatArrayMessageReader *)(puVar16 + 6),array,options);
    sVar13 = local_98.size_;
    pwVar12 = local_98.ptr;
    if ((SegmentBuilder *)local_98.ptr != (SegmentBuilder *)0x0) {
      local_98.ptr = (word *)0x0;
      local_98.size_ = 0;
      (**(_func_int **)*(WirePointer *)local_98.disposer)
                (local_98.disposer,pwVar12,8,sVar13,sVar13,0);
    }
    if ((this->connection->currentBlock).ptr.isSet == true) {
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_c8);
      local_d0.ptr = (PromiseNode *)local_c8._0_8_;
      pSVar20 = (SegmentBuilder *)local_c8._0_8_;
    }
    else {
      kj::yield();
      pSVar20 = (SegmentBuilder *)local_c8._0_8_;
      local_d0.ptr = (PromiseNode *)local_c8._0_8_;
      pCVar15 = this->connection;
      if (((pCVar15->blockAfterPredicate).ptr.isSet & 1U) != 0) {
        MessageBuilder::getRootInternal(local_78,&this_00->super_MessageBuilder);
        local_98.disposer = (ArrayDisposer *)local_78[0].builder.pointer;
        local_98.ptr = (word *)local_78[0].builder.segment;
        local_98.size_ = (size_t)local_78[0].builder.capTable;
        PointerBuilder::getStruct
                  ((StructBuilder *)local_c8,(PointerBuilder *)&local_98,(StructSize)0x10001,
                   (word *)0x0);
        StructBuilder::asReader((StructBuilder *)local_c8);
        iVar14 = (**((pCVar15->blockAfterPredicate).ptr.field_1.value.impl.ptr)->_vptr_Iface)();
        if ((char)iVar14 != '\0') {
          pCVar15 = this->connection;
          params = (WeakFulfiller<void> *)operator_new(0x18);
          (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
          (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
               (_func_int **)&PTR_reject_006b66f0;
          (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
               (_func_int **)&PTR_disposeImpl_006b6728;
          kj::_::PromiseDisposer::
          alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
                    ((PromiseDisposer *)local_c8,params);
          local_98.ptr = (word *)0x50371b;
          local_98.size_ = 0x503bc9;
          local_98.disposer = (ArrayDisposer *)0x160000013e;
          local_c8._8_8_ = &params->super_WeakFulfillerBase;
          local_c8._16_8_ = params;
          kj::Promise<void>::fork((Promise<void> *)local_78);
          if ((pCVar15->currentBlock).ptr.isSet == true) {
            (pCVar15->currentBlock).ptr.isSet = false;
            pFVar4 = (pCVar15->currentBlock).ptr.field_1.value.hub.ptr;
            if (pFVar4 != (ForkHub<kj::_::Void> *)0x0) {
              (pCVar15->currentBlock).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
              pDVar5 = (pCVar15->currentBlock).ptr.field_1.value.hub.disposer;
              (**pDVar5->_vptr_Disposer)
                        (pDVar5,(_func_int *)
                                ((long)&(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                                        _vptr_PromiseArenaMember +
                                (long)(pFVar4->super_ForkHubBase).super_PromiseArenaMember.
                                      _vptr_PromiseArenaMember[-2]));
            }
          }
          (pCVar15->currentBlock).ptr.field_1.value.hub.disposer =
               (Disposer *)local_78[0].builder.segment;
          (pCVar15->currentBlock).ptr.field_1.value.hub.ptr =
               (ForkHub<kj::_::Void> *)local_78[0].builder.capTable;
          (pCVar15->currentBlock).ptr.isSet = true;
          pDVar5 = (pCVar15->currentBlockFulfiller).ptr.disposer;
          pPVar6 = (pCVar15->currentBlockFulfiller).ptr.ptr;
          uVar10 = local_c8._16_4_;
          uVar11 = local_c8._20_4_;
          local_c8._16_8_ = (WirePointer *)0x0;
          *(undefined4 *)&(pCVar15->currentBlockFulfiller).ptr.disposer = local_c8._8_4_;
          *(undefined4 *)((long)&(pCVar15->currentBlockFulfiller).ptr.disposer + 4) =
               local_c8._12_4_;
          *(undefined4 *)&(pCVar15->currentBlockFulfiller).ptr.ptr = uVar10;
          *(undefined4 *)((long)&(pCVar15->currentBlockFulfiller).ptr.ptr + 4) = uVar11;
          if (pPVar6 != (PromiseFulfiller<void> *)0x0) {
            (**pDVar5->_vptr_Disposer)
                      (pDVar5,(_func_int *)
                              ((long)&(pPVar6->super_PromiseRejector)._vptr_PromiseRejector +
                              (long)(pPVar6->super_PromiseRejector)._vptr_PromiseRejector[-2]));
            uVar9 = local_c8._16_8_;
            if ((WirePointer *)local_c8._16_8_ != (WirePointer *)0x0) {
              local_c8._16_8_ = (WirePointer *)0x0;
              (**((Disposer *)local_c8._8_8_)->_vptr_Disposer)
                        (local_c8._8_8_,
                         (_func_int *)
                         ((long)&(((Maybe<kj::Exception> *)uVar9)->ptr).isSet +
                         (long)*(_func_int **)((long)*(WirePointer *)uVar9 + -0x10)));
            }
          }
          uVar9 = local_c8._0_8_;
          if ((PromiseNode *)local_c8._0_8_ != (PromiseNode *)0x0) {
            local_c8._0_8_ = (SegmentBuilder *)0x0;
            kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar9);
          }
          pCVar15 = this->connection;
          if ((pCVar15->blockAfterPredicate).ptr.isSet == true) {
            (pCVar15->blockAfterPredicate).ptr.isSet = false;
            pIVar7 = (pCVar15->blockAfterPredicate).ptr.field_1.value.impl.ptr;
            if (pIVar7 != (Iface *)0x0) {
              (pCVar15->blockAfterPredicate).ptr.field_1.value.impl.ptr = (Iface *)0x0;
              pDVar5 = (pCVar15->blockAfterPredicate).ptr.field_1.value.impl.disposer;
              (**pDVar5->_vptr_Disposer)
                        (pDVar5,(_func_int *)
                                ((long)&pIVar7->_vptr_Iface + (long)pIVar7->_vptr_Iface[-2]));
            }
          }
        }
      }
    }
    pCVar15 = this->connection;
    this_01 = (pCVar15->tasks).ptr;
    pPVar8 = *(PromiseArena **)&(pSVar20->super_SegmentReader).id;
    if (pPVar8 == (PromiseArena *)0x0 || (ulong)((long)pSVar20 - (long)pPVar8) < 0x38) {
      pvVar17 = operator_new(0x400);
      this_02 = (SegmentBuilder *)((long)pvVar17 + 0x3c8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_02,&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:402:13)>
                 ::anon_class_24_2_d9090f80_for_func::operator());
      *(undefined ***)((long)pvVar17 + 0x3c8) = &PTR_destroy_006ba140;
      *(ConnectionImpl **)((long)pvVar17 + 1000) = pCVar15;
      *(undefined8 **)((long)pvVar17 + 0x3f0) =
           &kj::_::
            HeapDisposer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl>
            ::instance;
      *(undefined8 **)((long)pvVar17 + 0x3f8) = puVar16;
      *(void **)((long)pvVar17 + 0x3d0) = pvVar17;
    }
    else {
      *(PromiseArena **)&(pSVar20->super_SegmentReader).id = (PromiseArena *)0x0;
      this_02 = pSVar20 + -1;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_02,&local_d0,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:402:13)>
                 ::anon_class_24_2_d9090f80_for_func::operator());
      pSVar20[-1].super_SegmentReader.arena = (Arena *)&PTR_destroy_006ba140;
      pSVar20[-1].super_SegmentReader.readLimiter = (ReadLimiter *)pCVar15;
      pSVar20[-1].pos =
           (word *)&kj::_::
                    HeapDisposer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl>
                    ::instance;
      *(undefined8 **)&pSVar20[-1].readOnly = puVar16;
      *(PromiseArena **)&pSVar20[-1].super_SegmentReader.id.value = pPVar8;
    }
    local_c8._0_8_ = this_02;
    kj::TaskSet::add(this_01,(Promise<void> *)local_c8);
    uVar9 = local_c8._0_8_;
    pCVar15 = extraout_RAX;
    if ((SegmentBuilder *)local_c8._0_8_ != (SegmentBuilder *)0x0) {
      local_c8._0_8_ = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar9);
      pCVar15 = extraout_RAX_00;
    }
    node.ptr = local_d0.ptr;
    if ((SegmentBuilder *)local_d0.ptr != (SegmentBuilder *)0x0) {
      local_d0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      pCVar15 = extraout_RAX_01;
    }
  }
  return (ssize_t)pCVar15;
}

Assistant:

void send() override {
        KJ_EXPECT(!connection.idle);
        if (!connection.vat.sendCallback(message)) return;

        if (connection.networkException != kj::none) {
          return;
        }

        ++connection.vat.sent;

        // Uncomment to get a debug dump.
//        connection.dumper.dump(message.getRoot<rpc::Message>());

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        kj::Promise<void> blocker = nullptr;
        KJ_IF_SOME(b, connection.currentBlock) {
          blocker = b.addBranch();
        } else {
          blocker = kj::yield();

          // Check if we should start blocking.
          KJ_IF_SOME(p, connection.blockAfterPredicate) {
            if (p(message.getRoot<rpc::Message>())) {
              connection.block();
              connection.blockAfterPredicate = kj::none;
            }
          }
        }